

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O0

void __thiscall higan::Acceptor::Acceptor(Acceptor *this,EventLoop *loop,InetAddress *address)

{
  EventLoop *loop_00;
  int fd;
  Acceptor *local_a8;
  code *local_a0;
  undefined8 local_98;
  type local_90;
  ChannelCallback local_78;
  allocator<char> local_41;
  string local_40;
  InetAddress *local_20;
  InetAddress *address_local;
  EventLoop *loop_local;
  Acceptor *this_local;
  
  this->loop_ = loop;
  local_20 = address;
  address_local = (InetAddress *)loop;
  loop_local = (EventLoop *)this;
  Socket::Socket(&this->listening_socket_,address);
  loop_00 = this->loop_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"acceptor",&local_41);
  fd = Socket::GetFd(&this->listening_socket_);
  Channel::Channel(&this->channel_,loop_00,&local_40,fd);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::function<void_(int,_const_higan::InetAddress_&)>::function(&this->newconnection_callback_);
  Socket::SetReuseAddr(&this->listening_socket_);
  Socket::SetReusePort(&this->listening_socket_);
  Socket::Bind(&this->listening_socket_);
  local_a0 = OnNewConnectionInternal;
  local_98 = 0;
  local_a8 = this;
  std::bind<void(higan::Acceptor::*)(),higan::Acceptor*>
            (&local_90,(offset_in_Acceptor_to_subr *)&local_a0,&local_a8);
  std::function<void()>::function<std::_Bind<void(higan::Acceptor::*(higan::Acceptor*))()>,void>
            ((function<void()> *)&local_78,&local_90);
  Channel::SetReadableCallback(&this->channel_,&local_78);
  std::function<void_()>::~function(&local_78);
  return;
}

Assistant:

Acceptor::Acceptor(EventLoop* loop, const InetAddress& address):
		loop_(loop),
		listening_socket_(address),
		channel_(loop_, "acceptor", listening_socket_.GetFd())
{
	listening_socket_.SetReuseAddr();
	listening_socket_.SetReusePort();
	listening_socket_.Bind();

	channel_.SetReadableCallback(std::bind(&Acceptor::OnNewConnectionInternal, this));
}